

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

__m128i lowbd_get_recon_16x16_sse2(__m128i pred,__m128i res0,__m128i res1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  longlong in_RAX;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  __m128i alVar5;
  undefined1 local_118 [14];
  undefined1 uStack_10a;
  undefined1 local_108 [14];
  undefined1 uStack_fa;
  __m128i x1;
  __m128i x0;
  __m128i zero;
  __m128i res1_local;
  __m128i res0_local;
  __m128i pred_local;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  
  zero[1]._0_1_ = (byte)in_XMM0_Qa;
  zero[1]._1_1_ = (undefined1)((ulong)in_XMM0_Qa >> 8);
  zero[1]._2_1_ = (undefined1)((ulong)in_XMM0_Qa >> 0x10);
  zero[1]._3_1_ = (undefined1)((ulong)in_XMM0_Qa >> 0x18);
  zero[1]._4_1_ = (undefined1)((ulong)in_XMM0_Qa >> 0x20);
  zero[1]._5_1_ = (undefined1)((ulong)in_XMM0_Qa >> 0x28);
  zero[1]._6_1_ = (undefined1)((ulong)in_XMM0_Qa >> 0x30);
  zero[1]._7_1_ = (undefined1)((ulong)in_XMM0_Qa >> 0x38);
  local_108[1] = 0;
  local_108[0] = (byte)zero[1];
  local_108[2] = zero[1]._1_1_;
  local_108[3] = 0;
  local_108[4] = zero[1]._2_1_;
  local_108[5] = 0;
  local_108[6] = zero[1]._3_1_;
  local_108[7] = 0;
  local_108[8] = zero[1]._4_1_;
  local_108[9] = 0;
  local_108[10] = zero[1]._5_1_;
  local_108[0xb] = 0;
  local_108[0xc] = zero[1]._6_1_;
  local_108[0xd] = 0;
  uStack_fa = zero[1]._7_1_;
  uStack_10 = (byte)in_XMM0_Qb;
  uStack_f = (undefined1)((ulong)in_XMM0_Qb >> 8);
  uStack_e = (undefined1)((ulong)in_XMM0_Qb >> 0x10);
  uStack_d = (undefined1)((ulong)in_XMM0_Qb >> 0x18);
  uStack_c = (undefined1)((ulong)in_XMM0_Qb >> 0x20);
  uStack_b = (undefined1)((ulong)in_XMM0_Qb >> 0x28);
  uStack_a = (undefined1)((ulong)in_XMM0_Qb >> 0x30);
  uStack_9 = (undefined1)((ulong)in_XMM0_Qb >> 0x38);
  local_118[1] = 0;
  local_118[0] = uStack_10;
  local_118[2] = uStack_f;
  local_118[3] = 0;
  local_118[4] = uStack_e;
  local_118[5] = 0;
  local_118[6] = uStack_d;
  local_118[7] = 0;
  local_118[8] = uStack_c;
  local_118[9] = 0;
  local_118[10] = uStack_b;
  local_118[0xb] = 0;
  local_118[0xc] = uStack_a;
  local_118[0xd] = 0;
  uStack_10a = uStack_9;
  auVar4._8_8_ = in_XMM1_Qb;
  auVar4._0_8_ = in_XMM1_Qa;
  auVar3._8_7_ = local_108._8_7_;
  auVar3._0_8_ = local_108._0_8_;
  auVar3[0xf] = 0;
  paddsw(auVar4,auVar3);
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = in_XMM2_Qa;
  auVar1._8_7_ = local_118._8_7_;
  auVar1._0_8_ = local_118._0_8_;
  auVar1[0xf] = 0;
  paddsw(auVar2,auVar1);
  alVar5[1] = res0[0];
  alVar5[0] = in_RAX;
  return alVar5;
}

Assistant:

static inline __m128i lowbd_get_recon_16x16_sse2(const __m128i pred,
                                                 __m128i res0, __m128i res1) {
  const __m128i zero = _mm_setzero_si128();
  __m128i x0 = _mm_unpacklo_epi8(pred, zero);
  __m128i x1 = _mm_unpackhi_epi8(pred, zero);
  x0 = _mm_adds_epi16(res0, x0);
  x1 = _mm_adds_epi16(res1, x1);
  return _mm_packus_epi16(x0, x1);
}